

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

void __thiscall imrt::Volume::print_deposition(Volume *this)

{
  int angle;
  int iVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  int i;
  long lVar4;
  int j;
  long lVar5;
  pair<const_int,_maths::Matrix> d;
  pair<const_int,_maths::Matrix> local_48;
  
  for (p_Var3 = (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->D)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::pair<const_int,_maths::Matrix>::pair
              (&local_48,(pair<const_int,_maths::Matrix> *)(p_Var3 + 1));
    angle = local_48.first;
    poVar2 = std::operator<<((ostream *)&std::cout,"ANGLE: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,angle);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar4 = 0; lVar4 < this->nb_voxels; lVar4 = lVar4 + 1) {
      lVar5 = 0;
      while( true ) {
        iVar1 = Collimator::getNangleBeamlets(this->collimator,angle);
        if (iVar1 <= lVar5) break;
        poVar2 = std::ostream::_M_insert<double>(local_48.second.p[lVar4][lVar5]);
        std::operator<<(poVar2,",");
        lVar5 = lVar5 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    maths::Matrix::~Matrix(&local_48.second);
  }
  return;
}

Assistant:

void Volume::print_deposition() {
  for(auto d:D){
  //for (int a=0; a< nb_angles; a++) {
    int angle=d.first;
    Matrix* dm=&d.second;
    cout << "ANGLE: " << angle << endl;
    for (int i=0;i<nb_voxels;i++) {
      for (int j=0;j<collimator.getNangleBeamlets(angle);j++)
        cout << (*dm)(i,j) << ",";
      cout << endl;
    }
  }
}